

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O0

void __thiscall
PyreNet::NeuralNet::mutate_uniform(NeuralNet *this,double lower,double upper,int layer)

{
  bool bVar1;
  size_type sVar2;
  InvalidNetworkSize *this_00;
  reference this_01;
  InvalidLayer *this_02;
  reference this_03;
  Layer *l;
  iterator __end2;
  iterator __begin2;
  vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_> *__range2;
  int layer_local;
  double upper_local;
  double lower_local;
  NeuralNet *this_local;
  
  sVar2 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::size(&this->layers);
  if ((sVar2 < 3) || (this->inputSize == 0)) {
    this_00 = (InvalidNetworkSize *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    InvalidNetworkSize::InvalidNetworkSize(this_00);
    __cxa_throw(this_00,&InvalidNetworkSize::typeinfo,InvalidNetworkSize::~InvalidNetworkSize);
  }
  if (layer == -1) {
    __end2 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::begin(&this->layers);
    l = (Layer *)std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::end(&this->layers);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
                                       *)&l), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
                ::operator*(&__end2);
      Layer::mutate_uniform(this_01,lower,upper);
      __gnu_cxx::
      __normal_iterator<PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    if ((layer < 0) ||
       (sVar2 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::size(&this->layers),
       sVar2 <= (ulong)(long)layer)) {
      this_02 = (InvalidLayer *)__cxa_allocate_exception(8);
      memset(this_02,0,8);
      InvalidLayer::InvalidLayer(this_02);
      __cxa_throw(this_02,&InvalidLayer::typeinfo,InvalidLayer::~InvalidLayer);
    }
    this_03 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::operator[]
                        (&this->layers,(long)layer);
    Layer::mutate_uniform(this_03,lower,upper);
  }
  return;
}

Assistant:

void NeuralNet::mutate_uniform(const double lower, const double upper, int layer) {
        if (this->layers.size() < 3 || this->inputSize == 0) throw InvalidNetworkSize();
        if (layer == -1) {
            for (Layer &l : this->layers) {
                l.mutate_uniform(lower, upper);
            }
        } else {
            if (layer < 0 || layer >= this->layers.size())
                throw InvalidLayer();
            this->layers[layer].mutate_uniform(lower, upper);
        }
    }